

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_unix.c
# Opt level: O1

int w_format_msg_va(char *msg,size_t msg_len,char *fmt,__va_list_tag *args)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  if ((msg == (char *)0x0) || (fmt == (char *)0x0)) {
    _exit(-1);
  }
  puVar2 = (uint *)__errno_location();
  *puVar2 = 0;
  uVar1 = vsnprintf(msg,msg_len,fmt,args);
  if ((int)uVar1 < 0) {
    uVar5 = -(uint)(*puVar2 == 0) | *puVar2;
  }
  else {
    uVar5 = 0;
    if (6 < msg_len && msg_len <= uVar1) {
      lVar3 = msg_len - 7;
      if (lVar3 != 0) {
        lVar4 = msg_len - 8;
        lVar3 = 0;
        do {
          if (msg[lVar4] == ' ') {
            lVar3 = lVar4 + 1;
            break;
          }
          bVar6 = lVar4 != 0;
          lVar4 = lVar4 + -1;
        } while (bVar6);
      }
      strncpy(msg + lVar3,anon_var_dwarf_2679,msg_len - lVar3);
      uVar5 = 0;
    }
  }
  return uVar5;
}

Assistant:

int
w_format_msg_va(
    char *msg,
    size_t msg_len,
    const char *fmt,
    va_list args
)
{
    int result;

    WP_PLATFORM_ASSERT(msg != NULL);
    WP_PLATFORM_ASSERT(fmt != NULL);

    errno = 0;
    result = vsnprintf(msg, msg_len, fmt, args);
    if (result < 0)
    {
        return wp_platform_enforce_error(errno);
    }
    else if ((size_t)result >= msg_len)
    {
        wp_platform_truncate(msg, msg_len);
    }

    return 0;
}